

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v10::detail::utf8_decode(char *s,uint32_t *c,int *e)

{
  int iVar1;
  uint *in_RDX;
  uint *in_RSI;
  byte *in_RDI;
  undefined8 local_98;
  undefined8 local_90;
  undefined4 local_88;
  char *next;
  undefined8 uStack_78;
  int len;
  int shifte [5];
  int shiftc [5];
  uint32_t mins [5];
  
  mins[0] = 0x1f;
  mins[1] = 0xf;
  mins[2] = 7;
  shiftc[0] = 0x80;
  shiftc[1] = 0x800;
  shiftc[2] = 0x10000;
  uStack_78 = 0x1200000000;
  shifte[0] = 0xc;
  shifte[1] = 6;
  shifte[2] = 0;
  local_98 = 0x600000000;
  local_90 = 0x200000004;
  local_88 = 0;
  iVar1 = (int)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
               [(int)(uint)*in_RDI >> 3];
  *in_RSI = ((uint)*in_RDI & mins[(long)iVar1 + -2]) << 0x12;
  *in_RSI = (in_RDI[1] & 0x3f) << 0xc | *in_RSI;
  *in_RSI = (in_RDI[2] & 0x3f) << 6 | *in_RSI;
  *in_RSI = in_RDI[3] & 0x3f | *in_RSI;
  *in_RSI = *in_RSI >>
            ((byte)*(undefined4 *)((long)&stack0xffffffffffffff88 + (long)iVar1 * 4) & 0x1f);
  *in_RDX = (uint)(*in_RSI < (uint)shiftc[(long)iVar1 + -2]) << 6;
  *in_RDX = (uint)(*in_RSI >> 0xb == 0x1b) << 7 | *in_RDX;
  *in_RDX = (uint)(0x10ffff < *in_RSI) << 8 | *in_RDX;
  *in_RDX = (int)(in_RDI[1] & 0xc0) >> 2 | *in_RDX;
  *in_RDX = (int)(in_RDI[2] & 0xc0) >> 4 | *in_RDX;
  *in_RDX = (int)(uint)in_RDI[3] >> 6 | *in_RDX;
  *in_RDX = *in_RDX ^ 0x2a;
  *in_RDX = (int)*in_RDX >> ((byte)*(undefined4 *)((long)&local_98 + (long)iVar1 * 4) & 0x1f);
  return (char *)(in_RDI + (long)(int)(uint)((iVar1 != 0 ^ 0xffU) & 1) + (long)iVar1);
}

Assistant:

FMT_CONSTEXPR inline auto utf8_decode(const char* s, uint32_t* c, int* e)
    -> const char* {
  constexpr const int masks[] = {0x00, 0x7f, 0x1f, 0x0f, 0x07};
  constexpr const uint32_t mins[] = {4194304, 0, 128, 2048, 65536};
  constexpr const int shiftc[] = {0, 18, 12, 6, 0};
  constexpr const int shifte[] = {0, 6, 4, 2, 0};

  int len = "\1\1\1\1\1\1\1\1\1\1\1\1\1\1\1\1\0\0\0\0\0\0\0\0\2\2\2\2\3\3\4"
      [static_cast<unsigned char>(*s) >> 3];
  // Compute the pointer to the next character early so that the next
  // iteration can start working on the next character. Neither Clang
  // nor GCC figure out this reordering on their own.
  const char* next = s + len + !len;

  using uchar = unsigned char;

  // Assume a four-byte character and load four bytes. Unused bits are
  // shifted out.
  *c = uint32_t(uchar(s[0]) & masks[len]) << 18;
  *c |= uint32_t(uchar(s[1]) & 0x3f) << 12;
  *c |= uint32_t(uchar(s[2]) & 0x3f) << 6;
  *c |= uint32_t(uchar(s[3]) & 0x3f) << 0;
  *c >>= shiftc[len];

  // Accumulate the various error conditions.
  *e = (*c < mins[len]) << 6;       // non-canonical encoding
  *e |= ((*c >> 11) == 0x1b) << 7;  // surrogate half?
  *e |= (*c > 0x10FFFF) << 8;       // out of range?
  *e |= (uchar(s[1]) & 0xc0) >> 2;
  *e |= (uchar(s[2]) & 0xc0) >> 4;
  *e |= uchar(s[3]) >> 6;
  *e ^= 0x2a;  // top two bits of each tail byte correct?
  *e >>= shifte[len];

  return next;
}